

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp_info.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  MzpArchiveEntry *header;
  MzpArchiveEntry *this;
  undefined1 local_88 [8];
  string archive_data;
  Mzp mzp;
  
  if (argc == 2) {
    local_88 = (undefined1  [8])&archive_data._M_string_length;
    archive_data._M_dataplus._M_p = (pointer)0x0;
    archive_data._M_string_length._0_1_ = 0;
    bVar1 = mg::fs::read_file(argv[1],(string *)local_88);
    if (bVar1) {
      bVar1 = mg::data::mzp_read((string *)local_88,(Mzp *)((long)&archive_data.field_2 + 8));
      if (bVar1) {
        fprintf(_stderr,"MZP archive of %lu elements:\n",0);
        for (this = (MzpArchiveEntry *)0x0; this != (MzpArchiveEntry *)0x0; this = this + 1) {
          mg::data::Mzp::MzpArchiveEntry::print(this);
        }
        iVar2 = 0;
      }
      else {
        fwrite("Failed to parse archive\n",0x18,1,_stderr);
        iVar2 = -1;
      }
      mg::data::Mzp::~Mzp((Mzp *)((long)&archive_data.field_2 + 8));
    }
    else {
      iVar2 = -1;
    }
    std::__cxx11::string::~string((string *)local_88);
  }
  else {
    fprintf(_stderr,"%s infile\n",*argv);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 2) {
    fprintf(stderr, "%s infile\n", argv[0]);
    return -1;
  }

  // Read input file
  std::string archive_data;
  if (!mg::fs::read_file(argv[1], archive_data)) {
    return -1;
  }

  // Extract header
  mg::data::Mzp mzp;
  if (!mg::data::mzp_read(archive_data, mzp)) {
    fprintf(stderr, "Failed to parse archive\n");
    return -1;
  }

  fprintf(stderr, "MZP archive of %lu elements:\n", mzp.entry_headers.size());
  for (auto &header : mzp.entry_headers) {
    header.print();
  }

  for (unsigned i = 0; i < mzp.entry_headers.size(); i++) {
    for (unsigned j = i + 1; j < mzp.entry_headers.size(); j++) {
      // Do these ranges overlap
      auto &entry_i = mzp.entry_headers[i];
      auto &entry_j = mzp.entry_headers[j];
      const uint32_t entry_i_start = entry_i.data_offset_relative();
      const uint32_t entry_i_end = entry_i_start + entry_i.entry_data_size();
      const uint32_t entry_j_start = entry_j.data_offset_relative();
      if (entry_j_start >= entry_i_start && entry_j_start <= entry_i_end) {
        fprintf(stderr, "Entry %u begins inside of entry %u\n", j, i);
      }
    }
  }

  return 0;
}